

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_threaded_resampler.cpp
# Opt level: O0

bool __thiscall crnlib::threaded_resampler::resample(threaded_resampler *this,params *p)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  Contrib_List *pCVar4;
  long lVar5;
  uint local_4c;
  uint i_1;
  uint local_34;
  uint i;
  resample_filter *filter;
  int filter_index;
  params *p_local;
  threaded_resampler *this_local;
  
  free_contrib_lists(this);
  this->m_pParams = p;
  if (p->m_fmt == cPF_Y_F32) {
    this->m_bytes_per_pixel = 4;
  }
  else {
    if (1 < p->m_fmt - cPF_RGBX_F32) {
      return false;
    }
    this->m_bytes_per_pixel = 0x10;
  }
  iVar2 = find_resample_filter(p->m_Pfilter_name);
  if (iVar2 < 0) {
    this_local._7_1_ = false;
  }
  else {
    lVar5 = (long)iVar2 * 0x30;
    pCVar4 = Resampler::make_clist
                       (this->m_pParams->m_src_width,this->m_pParams->m_dst_width,
                        this->m_pParams->m_boundary_op,
                        *(_func_Resample_Real_Resample_Real **)(&DAT_00269ac0 + lVar5),
                        *(Resample_Real *)(&DAT_00269ac8 + lVar5),p->m_filter_x_scale,0.0);
    this->m_pX_contribs = pCVar4;
    if (this->m_pX_contribs == (Contrib_List *)0x0) {
      this_local._7_1_ = false;
    }
    else {
      pCVar4 = Resampler::make_clist
                         (this->m_pParams->m_src_height,this->m_pParams->m_dst_height,
                          this->m_pParams->m_boundary_op,
                          *(_func_Resample_Real_Resample_Real **)(&DAT_00269ac0 + lVar5),
                          *(Resample_Real *)(&DAT_00269ac8 + lVar5),p->m_filter_y_scale,0.0);
      this->m_pY_contribs = pCVar4;
      if (this->m_pY_contribs == (Contrib_List *)0x0) {
        this_local._7_1_ = false;
      }
      else {
        bVar1 = vector<crnlib::vec<4U,_float>_>::try_resize
                          (&this->m_tmp_img,
                           this->m_pParams->m_dst_width * this->m_pParams->m_src_height,false);
        if (bVar1) {
          for (local_34 = 0; uVar3 = task_pool::get_num_threads(this->m_pTask_pool),
              local_34 <= uVar3; local_34 = local_34 + 1) {
            task_pool::
            queue_object_task<crnlib::threaded_resampler,void(crnlib::threaded_resampler::*)(unsigned_long_long,void*)>
                      (this->m_pTask_pool,this,0x17aba0,0,(void *)(ulong)local_34);
          }
          task_pool::join(this->m_pTask_pool);
          for (local_4c = 0; uVar3 = task_pool::get_num_threads(this->m_pTask_pool),
              local_4c <= uVar3; local_4c = local_4c + 1) {
            task_pool::
            queue_object_task<crnlib::threaded_resampler,void(crnlib::threaded_resampler::*)(unsigned_long_long,void*)>
                      (this->m_pTask_pool,this,0x17b280,0,(void *)(ulong)local_4c);
          }
          task_pool::join(this->m_pTask_pool);
          vector<crnlib::vec<4U,_float>_>::clear(&this->m_tmp_img);
          free_contrib_lists(this);
          this_local._7_1_ = true;
        }
        else {
          this_local._7_1_ = false;
        }
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool threaded_resampler::resample(const params& p)
    {
        free_contrib_lists();

        m_pParams = &p;

        CRNLIB_ASSERT(m_pParams->m_src_width && m_pParams->m_src_height);
        CRNLIB_ASSERT(m_pParams->m_dst_width && m_pParams->m_dst_height);

        switch (p.m_fmt)
        {
        case cPF_Y_F32:
            m_bytes_per_pixel = 4;
            break;
        case cPF_RGBX_F32:
        case cPF_RGBA_F32:
            m_bytes_per_pixel = 16;
            break;
        default:
            CRNLIB_ASSERT(false);
            return false;
        }

        int filter_index = find_resample_filter(p.m_Pfilter_name);
        if (filter_index < 0)
        {
            return false;
        }

        const resample_filter& filter = g_resample_filters[filter_index];

        m_pX_contribs = Resampler::make_clist(m_pParams->m_src_width, m_pParams->m_dst_width, m_pParams->m_boundary_op,
            filter.func, filter.support, p.m_filter_x_scale, 0.0f);
        if (!m_pX_contribs)
        {
            return false;
        }

        m_pY_contribs = Resampler::make_clist(m_pParams->m_src_height, m_pParams->m_dst_height,
            m_pParams->m_boundary_op, filter.func, filter.support, p.m_filter_y_scale,
            0.0f);
        if (!m_pY_contribs)
        {
            return false;
        }

        if (!m_tmp_img.try_resize(m_pParams->m_dst_width * m_pParams->m_src_height))
        {
            return false;
        }

        for (uint i = 0; i <= m_pTask_pool->get_num_threads(); i++)
        {
            m_pTask_pool->queue_object_task(this, &threaded_resampler::resample_x_task, i, nullptr);
        }
        m_pTask_pool->join();

        for (uint i = 0; i <= m_pTask_pool->get_num_threads(); i++)
        {
            m_pTask_pool->queue_object_task(this, &threaded_resampler::resample_y_task, i, nullptr);
        }
        m_pTask_pool->join();

        m_tmp_img.clear();
        free_contrib_lists();

        return true;
    }